

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::BitVector::setRange
          (BitVector *this,size_t offset,size_t count,bool value)

{
  uint *puVar1;
  pointer puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = count + offset;
  if ((offset & 0x1f) != 0 && offset < uVar6) {
    puVar2 = (this->m_data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (uint)offset & 0x1f;
    do {
      uVar4 = 1 << ((byte)uVar3 & 0x1f);
      if (value) {
        puVar1 = puVar2 + (offset >> 5);
        *puVar1 = *puVar1 | uVar4;
      }
      else {
        puVar1 = puVar2 + (offset >> 5);
        *puVar1 = *puVar1 & ~uVar4;
      }
      offset = offset + 1;
    } while ((offset < uVar6) && (uVar3 = uVar3 + 1, (offset & 0x1f) != 0));
  }
  uVar5 = uVar6 & 0xffffffffffffffe0;
  if (offset <= uVar5 && uVar5 - offset != 0) {
    memset((void *)((offset >> 3 & 0xfffffffffffffffc) +
                   (long)(this->m_data).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start),-(uint)value,uVar5 - offset >> 3);
    offset = uVar5;
  }
  if (offset < uVar6) {
    puVar2 = (this->m_data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar3 = 1 << ((byte)offset & 0x1f);
      if (value) {
        puVar1 = puVar2 + (offset >> 5);
        *puVar1 = *puVar1 | uVar3;
      }
      else {
        puVar1 = puVar2 + (offset >> 5);
        *puVar1 = *puVar1 & ~uVar3;
      }
      offset = offset + 1;
    } while (offset < uVar6);
  }
  return;
}

Assistant:

void setRange (size_t offset, size_t count, bool value)
	{
		size_t ndx = offset;

		for (; (ndx < offset + count) && ((ndx % BLOCK_BIT_SIZE) != 0); ndx++)
		{
			DE_ASSERT(ndx >= offset);
			DE_ASSERT(ndx < offset + count);
			set(ndx, value);
		}

		{
			const size_t endOfFullBlockNdx = roundDownToMultiple<size_t>(offset + count, BLOCK_BIT_SIZE);

			if (ndx < endOfFullBlockNdx)
			{
				deMemset(&m_data[ndx / BLOCK_BIT_SIZE], (value ? 0xFF : 0x0), (endOfFullBlockNdx - ndx) / 8);
				ndx = endOfFullBlockNdx;
			}
		}

		for (; ndx < offset + count; ndx++)
		{
			DE_ASSERT(ndx >= offset);
			DE_ASSERT(ndx < offset + count);
			set(ndx, value);
		}
	}